

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# emmy_debugger.cpp
# Opt level: O3

void __thiscall
Debugger::GetVariable
          (Debugger *this,lua_State *L,Idx<Variable> variable,int index,int depth,bool queryHelper)

{
  pointer *ppIVar1;
  pointer pVVar2;
  pointer pVVar3;
  iterator iVar4;
  uint uVar5;
  bool bVar6;
  int iVar7;
  uint uVar8;
  int iVar9;
  char *pcVar10;
  Variable *pVVar11;
  char *pcVar12;
  ostream *poVar13;
  ulong uVar14;
  string *psVar15;
  ulong __val;
  ulong uVar16;
  lua_Number lVar17;
  Idx<Variable> id;
  Idx<Variable> id_00;
  Idx<Variable> id_01;
  Idx<Variable> id_02;
  Idx<Variable> id_03;
  Idx<Variable> id_04;
  Idx<Variable> id_05;
  Idx<Variable> id_06;
  Idx<Variable> id_07;
  Idx<Variable> id_08;
  Idx<Variable> id_09;
  Idx<Variable> id_10;
  Idx<Variable> id_11;
  Idx<Variable> id_12;
  Idx<Variable> id_13;
  Idx<Variable> id_14;
  Idx<Variable> id_15;
  Idx<Variable> id_16;
  Idx<Variable> id_17;
  Idx<Variable> id_18;
  Idx<Variable> id_19;
  Idx<Variable> id_20;
  Idx<Variable> variable_00;
  Idx<Variable> variable_01;
  Idx<Variable> variable_02;
  Idx<Variable> variable_03;
  Idx<Variable> variable_04;
  Idx<Variable> variable_05;
  Idx<Variable> variable_06;
  Idx<Variable> variable_07;
  Idx<Variable> v;
  stringstream ss;
  Idx<Variable> local_1f0;
  undefined1 local_1e0 [20];
  int local_1cc;
  char *local_1c8;
  void *local_1c0;
  undefined1 local_1b8 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1a8;
  uint auStack_190 [22];
  ios_base local_138 [264];
  
  variable_00._arena = variable._arena;
  variable_00.Raw = variable.Raw;
  if (L == (lua_State *)0x0) {
    L = this->currentL;
  }
  if (depth < 1 || L == (lua_State *)0x0) {
    return;
  }
  local_1cc = (*lua_gettop)(L);
  iVar7 = lua_absindex(L,index);
  variable_00._4_4_ = 0;
  CacheValue(this,iVar7,variable_00);
  uVar8 = (*lua_type)(L,iVar7);
  uVar16 = (ulong)uVar8;
  pcVar10 = (*lua_typename)(L,uVar8);
  id._4_4_ = 0;
  id.Raw = variable_00.Raw;
  id._arena = variable_00._arena;
  pVVar11 = Arena<Variable>::Index(variable_00._arena,id);
  local_1c8 = (char *)(pVVar11->valueTypeName)._M_string_length;
  strlen(pcVar10);
  std::__cxx11::string::_M_replace((ulong)&pVVar11->valueTypeName,0,local_1c8,(ulong)pcVar10);
  id_00._4_4_ = 0;
  id_00.Raw = variable_00.Raw;
  id_00._arena = variable_00._arena;
  pVVar11 = Arena<Variable>::Index(variable_00._arena,id_00);
  pVVar11->valueType = uVar8;
  if (queryHelper) {
    if ((((uVar8 < 9) && (this->displayCustomTypeInfo != false)) &&
        (((this->registeredTypes).super__Base_bitset<1UL>._M_w >> (uVar16 & 0x3f) & 1) != 0)) &&
       (variable_01._4_4_ = 0, variable_01.Raw = variable_00.Raw,
       variable_01._arena = variable_00._arena,
       bVar6 = ExtensionPoint::QueryVariableCustom
                         (&this->manager->extension,L,variable_01,pcVar10,iVar7,depth), bVar6)) {
      return;
    }
    switch(uVar16) {
    case 0:
      goto switchD_00145320_caseD_0;
    case 1:
      goto switchD_00145320_caseD_1;
    case 2:
    case 8:
      goto switchD_00145320_caseD_2;
    case 3:
    case 4:
      goto switchD_00145320_caseD_3;
    case 5:
    case 6:
    case 7:
      variable_02._4_4_ = 0;
      variable_02.Raw = variable_00.Raw;
      variable_02._arena = variable_00._arena;
      bVar6 = ExtensionPoint::QueryVariable
                        (&this->manager->extension,L,variable_02,pcVar10,iVar7,depth);
      if (bVar6) {
        return;
      }
      break;
    default:
      goto switchD_00145320_default;
    }
  }
  switch(uVar16) {
  case 0:
    goto switchD_00145320_caseD_0;
  case 1:
switchD_00145320_caseD_1:
    iVar7 = (*lua_toboolean)(L,iVar7);
    pcVar12 = "true";
    if (iVar7 == 0) {
      pcVar12 = "false";
    }
    id_04._4_4_ = 0;
    id_04.Raw = variable_00.Raw;
    id_04._arena = variable_00._arena;
    pVVar11 = Arena<Variable>::Index(variable_00._arena,id_04);
    pcVar10 = (char *)(pVVar11->value)._M_string_length;
    psVar15 = &pVVar11->value;
    goto LAB_00145479;
  case 2:
  case 8:
switchD_00145320_caseD_2:
    ToPointer_abi_cxx11_((string *)local_1b8,L,iVar7);
    id_01._4_4_ = 0;
    id_01.Raw = variable_00.Raw;
    id_01._arena = variable_00._arena;
    pVVar11 = Arena<Variable>::Index(variable_00._arena,id_01);
    std::__cxx11::string::operator=((string *)&pVVar11->value,(string *)local_1b8);
    if ((undefined1 *)local_1b8._0_8_ != local_1b8 + 0x10) {
      operator_delete((void *)local_1b8._0_8_);
    }
    break;
  case 3:
  case 4:
switchD_00145320_caseD_3:
    pcVar12 = (*lua_tolstring)(L,iVar7,(size_t *)0x0);
    id_02._4_4_ = 0;
    id_02.Raw = variable_00.Raw;
    id_02._arena = variable_00._arena;
    pVVar11 = Arena<Variable>::Index(variable_00._arena,id_02);
    pcVar10 = (char *)(pVVar11->value)._M_string_length;
    psVar15 = &pVVar11->value;
    strlen(pcVar12);
LAB_00145479:
    std::__cxx11::string::_M_replace((ulong)psVar15,0,pcVar10,(ulong)pcVar12);
    break;
  case 5:
    local_1c0 = (*lua_topointer)(L,iVar7);
    (*lua_pushnil)(L);
    iVar9 = (*lua_next)(L,iVar7);
    if (iVar9 != 0) {
      local_1c8 = (char *)CONCAT44(local_1c8._4_4_,depth + -1);
      do {
        if (1 < (uint)depth) {
          pVVar2 = ((variable_00._arena)->_data).
                   super__Vector_base<Variable,_std::allocator<Variable>_>._M_impl.
                   super__Vector_impl_data._M_finish;
          pVVar3 = ((variable_00._arena)->_data).
                   super__Vector_base<Variable,_std::allocator<Variable>_>._M_impl.
                   super__Vector_impl_data._M_start;
          std::vector<Variable,_std::allocator<Variable>_>::emplace_back<>
                    (&(variable_00._arena)->_data);
          local_1f0.Raw = (int)((ulong)((long)pVVar2 - (long)pVVar3) >> 3) * 0x286bca1b;
          local_1f0._arena = variable_00._arena;
          iVar9 = (*lua_type)(L,-2);
          id_05._4_4_ = 0;
          id_05.Raw = local_1f0.Raw;
          id_05._arena = local_1f0._arena;
          pVVar11 = Arena<Variable>::Index(local_1f0._arena,id_05);
          pVVar11->nameType = iVar9;
          if (iVar9 == 1) {
            iVar9 = (*lua_toboolean)(L,-2);
            pcVar10 = "true";
            if (iVar9 == 0) {
              pcVar10 = "false";
            }
            id_07._4_4_ = 0;
            id_07.Raw = local_1f0.Raw;
            id_07._arena = local_1f0._arena;
            pVVar11 = Arena<Variable>::Index(local_1f0._arena,id_07);
            pcVar12 = (char *)(pVVar11->name)._M_string_length;
LAB_001456b7:
            std::__cxx11::string::_M_replace((ulong)&pVVar11->name,0,pcVar12,(ulong)pcVar10);
          }
          else if (iVar9 == 3) {
            lVar17 = lua_tonumber(L,-2);
            uVar16 = (ulong)lVar17;
            if ((lVar17 != (double)(long)uVar16) || (NAN(lVar17) || NAN((double)(long)uVar16))) {
              __gnu_cxx::__to_xstring<std::__cxx11::string,char>
                        ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_1b8,vsnprintf,0x148,"%f");
              id_10._4_4_ = 0;
              id_10.Raw = local_1f0.Raw;
              id_10._arena = local_1f0._arena;
              pVVar11 = Arena<Variable>::Index(local_1f0._arena,id_10);
            }
            else {
              __val = -uVar16;
              if (0 < (long)uVar16) {
                __val = uVar16;
              }
              uVar8 = 1;
              local_1b8._0_8_ = local_1b8 + 0x10;
              if (9 < __val) {
                uVar14 = __val;
                uVar5 = 4;
                do {
                  uVar8 = uVar5;
                  if (uVar14 < 100) {
                    uVar8 = uVar8 - 2;
                    goto LAB_001457f5;
                  }
                  if (uVar14 < 1000) {
                    uVar8 = uVar8 - 1;
                    goto LAB_001457f5;
                  }
                  if (uVar14 < 10000) goto LAB_001457f5;
                  bVar6 = 99999 < uVar14;
                  uVar14 = uVar14 / 10000;
                  uVar5 = uVar8 + 4;
                } while (bVar6);
                uVar8 = uVar8 + 1;
              }
LAB_001457f5:
              std::__cxx11::string::_M_construct
                        ((ulong)local_1b8,(char)uVar8 - (char)((long)uVar16 >> 0x3f));
              std::__detail::__to_chars_10_impl<unsigned_long_long>
                        ((char *)(local_1b8._0_8_ + -((long)uVar16 >> 0x3f)),uVar8,__val);
              id_11._4_4_ = 0;
              id_11.Raw = local_1f0.Raw;
              id_11._arena = local_1f0._arena;
              pVVar11 = Arena<Variable>::Index(local_1f0._arena,id_11);
            }
            std::__cxx11::string::operator=((string *)&pVVar11->name,(string *)local_1b8);
            if ((undefined1 *)local_1b8._0_8_ != local_1b8 + 0x10) {
LAB_0014570c:
              operator_delete((void *)local_1b8._0_8_);
            }
          }
          else {
            if (iVar9 == 4) {
              pcVar10 = (*lua_tolstring)(L,-2,(size_t *)0x0);
              id_06._4_4_ = 0;
              id_06.Raw = local_1f0.Raw;
              id_06._arena = local_1f0._arena;
              pVVar11 = Arena<Variable>::Index(local_1f0._arena,id_06);
              pcVar12 = (char *)(pVVar11->name)._M_string_length;
              strlen(pcVar10);
              goto LAB_001456b7;
            }
            ToPointer_abi_cxx11_((string *)local_1b8,L,-2);
            id_08._4_4_ = 0;
            id_08.Raw = local_1f0.Raw;
            id_08._arena = local_1f0._arena;
            pVVar11 = Arena<Variable>::Index(local_1f0._arena,id_08);
            std::__cxx11::string::operator=((string *)&pVVar11->name,(string *)local_1b8);
            if ((undefined1 *)local_1b8._0_8_ != local_1b8 + 0x10) goto LAB_0014570c;
          }
          variable_03._4_4_ = 0;
          variable_03.Raw = local_1f0.Raw;
          variable_03._arena = local_1f0._arena;
          GetVariable(this,L,variable_03,-1,(int)local_1c8,true);
          id_09._4_4_ = 0;
          id_09.Raw = variable_00.Raw;
          id_09._arena = variable_00._arena;
          pVVar11 = Arena<Variable>::Index(variable_00._arena,id_09);
          iVar4._M_current =
               (pVVar11->children).
               super__Vector_base<Idx<Variable>,_std::allocator<Idx<Variable>_>_>._M_impl.
               super__Vector_impl_data._M_finish;
          if (iVar4._M_current ==
              (pVVar11->children).super__Vector_base<Idx<Variable>,_std::allocator<Idx<Variable>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage) {
            std::vector<Idx<Variable>,std::allocator<Idx<Variable>>>::
            _M_realloc_insert<Idx<Variable>const&>
                      ((vector<Idx<Variable>,std::allocator<Idx<Variable>>> *)&pVVar11->children,
                       iVar4,&local_1f0);
          }
          else {
            *(ulong *)iVar4._M_current = CONCAT44(local_1f0._4_4_,local_1f0.Raw);
            (iVar4._M_current)->_arena = local_1f0._arena;
            ppIVar1 = &(pVVar11->children).
                       super__Vector_base<Idx<Variable>,_std::allocator<Idx<Variable>_>_>._M_impl.
                       super__Vector_impl_data._M_finish;
            *ppIVar1 = *ppIVar1 + 1;
          }
        }
        (*lua_settop)(L,-2);
        iVar9 = (*lua_next)(L,iVar7);
      } while (iVar9 != 0);
    }
    iVar7 = (*lua_getmetatable)(L,iVar7);
    if (iVar7 != 0) {
      uVar8 = (int)((ulong)((long)((variable_00._arena)->_data).
                                  super__Vector_base<Variable,_std::allocator<Variable>_>._M_impl.
                                  super__Vector_impl_data._M_finish -
                           (long)((variable_00._arena)->_data).
                                 super__Vector_base<Variable,_std::allocator<Variable>_>._M_impl.
                                 super__Vector_impl_data._M_start) >> 3) * 0x286bca1b;
      std::vector<Variable,_std::allocator<Variable>_>::emplace_back<>(&(variable_00._arena)->_data)
      ;
      local_1b8._0_4_ = uVar8;
      id_13._4_4_ = 0;
      id_13.Raw = uVar8;
      id_13._arena = variable_00._arena;
      local_1b8._8_8_ = variable_00._arena;
      pVVar11 = Arena<Variable>::Index(variable_00._arena,id_13);
      std::__cxx11::string::operator=((string *)&pVVar11->name,"(metatable)");
      iVar7 = (*lua_type)(L,-1);
      id_14._4_4_ = 0;
      id_14.Raw = uVar8;
      id_14._arena = variable_00._arena;
      pVVar11 = Arena<Variable>::Index(variable_00._arena,id_14);
      pVVar11->nameType = iVar7;
      variable_05._4_4_ = 0;
      variable_05.Raw = uVar8;
      variable_05._arena = variable_00._arena;
      GetVariable(this,L,variable_05,-1,depth + -1,true);
      id_15._4_4_ = 0;
      id_15.Raw = variable_00.Raw;
      id_15._arena = variable_00._arena;
      pVVar11 = Arena<Variable>::Index(variable_00._arena,id_15);
      iVar4._M_current =
           (pVVar11->children).super__Vector_base<Idx<Variable>,_std::allocator<Idx<Variable>_>_>.
           _M_impl.super__Vector_impl_data._M_finish;
      if (iVar4._M_current ==
          (pVVar11->children).super__Vector_base<Idx<Variable>,_std::allocator<Idx<Variable>_>_>.
          _M_impl.super__Vector_impl_data._M_end_of_storage) {
        std::vector<Idx<Variable>,std::allocator<Idx<Variable>>>::
        _M_realloc_insert<Idx<Variable>const&>
                  ((vector<Idx<Variable>,std::allocator<Idx<Variable>>> *)&pVVar11->children,iVar4,
                   (Idx<Variable> *)local_1b8);
      }
      else {
        *(undefined8 *)iVar4._M_current = local_1b8._0_8_;
        (iVar4._M_current)->_arena = (ArenaClass *)local_1b8._8_8_;
        ppIVar1 = &(pVVar11->children).
                   super__Vector_base<Idx<Variable>,_std::allocator<Idx<Variable>_>_>._M_impl.
                   super__Vector_impl_data._M_finish;
        *ppIVar1 = *ppIVar1 + 1;
      }
      iVar7 = (*lua_type)(L,-1);
      if (iVar7 == 5) {
        (*lua_pushstring)(L,"__index");
        (*lua_rawget)(L,-2);
        iVar7 = (*lua_type)(L,-1);
        if (iVar7 != 0) {
          uVar8 = (int)((ulong)((long)((variable_00._arena)->_data).
                                      super__Vector_base<Variable,_std::allocator<Variable>_>.
                                      _M_impl.super__Vector_impl_data._M_finish -
                               (long)((variable_00._arena)->_data).
                                     super__Vector_base<Variable,_std::allocator<Variable>_>._M_impl
                                     .super__Vector_impl_data._M_start) >> 3) * 0x286bca1b;
          std::vector<Variable,_std::allocator<Variable>_>::emplace_back<>
                    (&(variable_00._arena)->_data);
          id_16._4_4_ = 0;
          id_16.Raw = uVar8;
          id_16._arena = variable_00._arena;
          local_1f0.Raw = uVar8;
          local_1f0._arena = variable_00._arena;
          pVVar11 = Arena<Variable>::Index(variable_00._arena,id_16);
          std::__cxx11::string::operator=((string *)&pVVar11->name,"(metatable.__index)");
          iVar7 = (*lua_type)(L,-1);
          id_17._4_4_ = 0;
          id_17.Raw = uVar8;
          id_17._arena = variable_00._arena;
          pVVar11 = Arena<Variable>::Index(variable_00._arena,id_17);
          pVVar11->nameType = iVar7;
          variable_06._4_4_ = 0;
          variable_06.Raw = uVar8;
          variable_06._arena = variable_00._arena;
          GetVariable(this,L,variable_06,-1,depth + -1,true);
          id_18._4_4_ = 0;
          id_18.Raw = variable_00.Raw;
          id_18._arena = variable_00._arena;
          pVVar11 = Arena<Variable>::Index(variable_00._arena,id_18);
          iVar4._M_current =
               (pVVar11->children).
               super__Vector_base<Idx<Variable>,_std::allocator<Idx<Variable>_>_>._M_impl.
               super__Vector_impl_data._M_finish;
          if (iVar4._M_current ==
              (pVVar11->children).super__Vector_base<Idx<Variable>,_std::allocator<Idx<Variable>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage) {
            std::vector<Idx<Variable>,std::allocator<Idx<Variable>>>::
            _M_realloc_insert<Idx<Variable>const&>
                      ((vector<Idx<Variable>,std::allocator<Idx<Variable>>> *)&pVVar11->children,
                       iVar4,&local_1f0);
          }
          else {
            *(ulong *)iVar4._M_current = CONCAT44(local_1f0._4_4_,local_1f0.Raw);
            (iVar4._M_current)->_arena = local_1f0._arena;
            ppIVar1 = &(pVVar11->children).
                       super__Vector_base<Idx<Variable>,_std::allocator<Idx<Variable>_>_>._M_impl.
                       super__Vector_impl_data._M_finish;
            *ppIVar1 = *ppIVar1 + 1;
          }
        }
        (*lua_settop)(L,-2);
      }
      (*lua_settop)(L,-2);
    }
    std::__cxx11::stringstream::stringstream((stringstream *)local_1b8);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)(local_1b8 + 0x10),"table(0x",8);
    *(uint *)((long)auStack_190 + *(long *)(local_1a8._M_allocated_capacity - 0x18)) =
         *(uint *)((long)auStack_190 + *(long *)(local_1a8._M_allocated_capacity - 0x18)) &
         0xffffffb5 | 8;
    poVar13 = std::ostream::_M_insert<void_const*>((ostream *)(local_1b8 + 0x10));
    *(uint *)(poVar13 + *(long *)(*(long *)poVar13 + -0x18) + 0x18) =
         *(uint *)(poVar13 + *(long *)(*(long *)poVar13 + -0x18) + 0x18) & 0xffffffb5 | 2;
    std::__ostream_insert<char,std::char_traits<char>>(poVar13,", size = ",9);
    poVar13 = std::ostream::_M_insert<unsigned_long>((ulong)poVar13);
    std::__ostream_insert<char,std::char_traits<char>>(poVar13,")",1);
    std::__cxx11::stringbuf::str();
    id_20._4_4_ = 0;
    id_20.Raw = variable_00.Raw;
    id_20._arena = variable_00._arena;
    pVVar11 = Arena<Variable>::Index(variable_00._arena,id_20);
    std::__cxx11::string::operator=((string *)&pVVar11->value,(string *)&local_1f0);
    if ((undefined1 *)CONCAT44(local_1f0._4_4_,local_1f0.Raw) != local_1e0) {
      operator_delete((undefined1 *)CONCAT44(local_1f0._4_4_,local_1f0.Raw));
    }
    std::__cxx11::stringstream::~stringstream((stringstream *)local_1b8);
    std::ios_base::~ios_base(local_138);
    break;
  case 6:
    variable_07._4_4_ = 0;
    variable_07.Raw = variable_00.Raw;
    variable_07._arena = variable_00._arena;
    DisplayFunction(variable_07,L,iVar7);
    break;
  case 7:
    pcVar10 = (*lua_tolstring)(L,iVar7,(size_t *)0x0);
    if (pcVar10 == (char *)0x0) {
      bVar6 = CallMetaFunction(L,local_1cc,"__tostring",1,(int *)local_1b8);
      if ((bVar6) && (local_1b8._0_4_ == 0)) {
        pcVar10 = (*lua_tolstring)(L,-1,(size_t *)0x0);
        (*lua_settop)(L,-2);
        if (pcVar10 != (char *)0x0) goto LAB_00145892;
      }
      ToPointer_abi_cxx11_((string *)local_1b8,L,iVar7);
      id_19._4_4_ = 0;
      id_19.Raw = variable_00.Raw;
      id_19._arena = variable_00._arena;
      pVVar11 = Arena<Variable>::Index(variable_00._arena,id_19);
      std::__cxx11::string::operator=((string *)&pVVar11->value,(string *)local_1b8);
      if ((undefined1 *)local_1b8._0_8_ != local_1b8 + 0x10) {
        operator_delete((void *)local_1b8._0_8_);
      }
    }
    else {
LAB_00145892:
      id_12._4_4_ = 0;
      id_12.Raw = variable_00.Raw;
      id_12._arena = variable_00._arena;
      pVVar11 = Arena<Variable>::Index(variable_00._arena,id_12);
      std::__cxx11::string::operator=((string *)&pVVar11->value,pcVar10);
    }
    if ((1 < (uint)depth) && (iVar7 = (*lua_getmetatable)(L,iVar7), iVar7 != 0)) {
      variable_04._4_4_ = 0;
      variable_04.Raw = variable_00.Raw;
      variable_04._arena = variable_00._arena;
      GetVariable(this,L,variable_04,-1,depth,true);
      (*lua_settop)(L,-2);
    }
  }
switchD_00145320_default:
  iVar7 = (*lua_gettop)(L);
  if (iVar7 == local_1cc) {
    return;
  }
  __assert_fail("t2 == topIndex",
                "/workspace/llm4binary/github/license_c_cmakelists/EmmyLua[P]EmmyLuaDebugger/emmy_debugger/src/debugger/emmy_debugger.cpp"
                ,0x208,"void Debugger::GetVariable(lua_State *, Idx<Variable>, int, int, bool)");
switchD_00145320_caseD_0:
  id_03._4_4_ = 0;
  id_03.Raw = variable_00.Raw;
  id_03._arena = variable_00._arena;
  pVVar11 = Arena<Variable>::Index(variable_00._arena,id_03);
  pcVar10 = (char *)(pVVar11->value)._M_string_length;
  psVar15 = &pVVar11->value;
  pcVar12 = "nil";
  goto LAB_00145479;
}

Assistant:

void Debugger::GetVariable(lua_State *L, Idx<Variable> variable, int index, int depth, bool queryHelper) {
	if (!L) {
		L = currentL;
	}

	if (!L) {
		return;
	}

	// 如果没有计算深度则不予计算
	if (depth <= 0) {
		return;
	}

	const int topIndex = lua_gettop(L);
	index = lua_absindex(L, index);
	CacheValue(index, variable);
	const int type = lua_type(L, index);
	const char *typeName = lua_typename(L, type);
	variable->valueTypeName = typeName;
	variable->valueType = type;

	if (queryHelper) {
		if (displayCustomTypeInfo && type >= 0 && type < registeredTypes.size() && registeredTypes.test(type)
			&& manager->extension.QueryVariableCustom(L, variable, typeName, index, depth)) {
			return;
		}
		else if ((type == LUA_TTABLE || type == LUA_TUSERDATA || type == LUA_TFUNCTION)
			&& manager->extension.QueryVariable(L, variable, typeName, index, depth)) {
			return;
		}
	}
	switch (type) {
		case LUA_TNIL: {
			variable->value = "nil";
			break;
		}
		case LUA_TNUMBER: {
			variable->value = lua_tostring(L, index);
			break;
		}
		case LUA_TBOOLEAN: {
			const bool v = lua_toboolean(L, index);
			variable->value = v ? "true" : "false";
			break;
		}
		case LUA_TSTRING: {
			variable->value = lua_tostring(L, index);
			break;
		}
		case LUA_TUSERDATA: {
			auto *string = lua_tostring(L, index);
			if (string == nullptr) {
				int result;
				if (CallMetaFunction(L, topIndex, "__tostring", 1, result) && result == 0) {
					string = lua_tostring(L, -1);
					lua_pop(L, 1);
				}
			}
			if (string) {
				variable->value = string;
			} else {
				variable->value = ToPointer(L, index);
			}
			if (depth > 1) {
				if (lua_getmetatable(L, index)) {
					GetVariable(L, variable, -1, depth);
					lua_pop(L, 1);//pop meta
				}
			}
			break;
		}
		case LUA_TFUNCTION: {
#ifndef EMMY_USE_LUA_SOURCE
			DisplayFunction(variable, L, index);
#else
			variable->value = ToPointer(L, index);
#endif

			break;
		}
		case LUA_TLIGHTUSERDATA:
		case LUA_TTHREAD: {
			variable->value = ToPointer(L, index);
			break;
		}
		case LUA_TTABLE: {
			std::size_t tableSize = 0;
			const void *tableAddr = lua_topointer(L, index);
			lua_pushnil(L);
			while (lua_next(L, index)) {
				// k: -2, v: -1
				if (depth > 1) {
					//todo: use allocator
					auto v = variable.GetArena()->Alloc();
					const auto t = lua_type(L, -2);
					v->nameType = t;
                    switch (t) {
                        case LUA_TSTRING:
                        {
                            v->name = lua_tostring(L, -2);
                            break;
                        }
                        case LUA_TNUMBER:
                        {
                            auto number = lua_tonumber(L, -2);
                            if (static_cast<long long>(number) == number) {
                                v->name = std::to_string(static_cast<long long>(number));
                            } else {
                                v->name = std::to_string(number);
                            }
                            break;
                        }
                        case LUA_TBOOLEAN:
                        {
                            v->name = lua_toboolean(L, -2) ? "true" : "false";
                            break;
                        }
                        default: {
                            v->name = ToPointer(L, -2);
                            break;
                        }
                    }

					GetVariable(L, v, -1, depth - 1);
					variable->children.push_back(v);
				}
				lua_pop(L, 1);
				tableSize++;
			}


			if (lua_getmetatable(L, index)) {
				// metatable
				auto metatable = variable.GetArena()->Alloc();
				metatable->name = "(metatable)";
				metatable->nameType = lua_type(L, -1);

				GetVariable(L, metatable, -1, depth - 1);
				variable->children.push_back(metatable);

				//__index
				if (lua_istable(L, -1)) {
					// fix BUG 导致涉及到FGUI的框架崩溃
					lua_pushstring(L, "__index");
					lua_rawget(L, -2);
					if (!lua_isnil(L, -1)) {
						auto v = variable.GetArena()->Alloc();
						v->name = "(metatable.__index)";
						v->nameType = lua_type(L, -1);
						GetVariable(L, v, -1, depth - 1);
						variable->children.push_back(v);
					}
					lua_pop(L, 1);
				}

				// metatable
				lua_pop(L, 1);
			}

			std::stringstream ss;
			ss << "table(0x" << std::hex << tableAddr << std::dec << ", size = " << tableSize << ")";
			variable->value = ss.str();
			break;
		}
	}
	const int t2 = lua_gettop(L);
	assert(t2 == topIndex);
}